

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

uint Catch::rngSeed(void)

{
  uint uVar1;
  IConfig *pIVar2;
  
  pIVar2 = getGlobalConfig();
  if (pIVar2 != (IConfig *)0x0) {
    pIVar2 = getGlobalConfig();
    uVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned int rngSeed() {
        return getGlobalConfig()
            ? getGlobalConfig()->rngSeed()
            : 0;
    }